

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

_Bool bitset_container_add(bitset_container_t *bitset,uint16_t pos)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint64_t increment;
  uint64_t new_word;
  int index;
  uint64_t old_word;
  uint16_t pos_local;
  bitset_container_t *bitset_local;
  
  bVar3 = (byte)pos & 0x3f;
  uVar1 = bitset->words[(int)(uint)pos >> 6] | 1L << bVar3;
  uVar2 = (bitset->words[(int)(uint)pos >> 6] ^ uVar1) >> bVar3;
  bitset->cardinality = (int)uVar2 + bitset->cardinality;
  bitset->words[(int)(uint)pos >> 6] = uVar1;
  return uVar2 != 0;
}

Assistant:

static inline bool bitset_container_add(bitset_container_t *bitset,
                                        uint16_t pos) {
    const uint64_t old_word = bitset->words[pos >> 6];
    const int index = pos & 63;
    const uint64_t new_word = old_word | (UINT64_C(1) << index);
    const uint64_t increment = (old_word ^ new_word) >> index;
    bitset->cardinality += (uint32_t)increment;
    bitset->words[pos >> 6] = new_word;
    return increment > 0;
}